

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

void __thiscall QPlainTextEdit::setDocument(QPlainTextEdit *this,QTextDocument *document)

{
  QPlainTextEditPrivate *this_00;
  QTextDocument *this_01;
  QPlainTextEditPrivate *pQVar1;
  QPlainTextDocumentLayoutPrivate *pQVar2;
  long in_RSI;
  long in_FS_OFFSET;
  QPlainTextDocumentLayout *documentLayout;
  QPlainTextEditPrivate *d;
  QPlainTextDocumentLayout *in_stack_ffffffffffffff98;
  QPlainTextEditPrivate *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  QAbstractTextDocumentLayout *document_00;
  QPlainTextEditPrivate *in_stack_ffffffffffffffb0;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QPlainTextEdit *)0x6c3f7a);
  if (in_RSI == 0) {
    this_01 = (QTextDocument *)operator_new(0x10);
    QTextDocument::QTextDocument(this_01,(QObject *)this_00->control);
    document_00 = (QAbstractTextDocumentLayout *)this_01;
    in_stack_ffffffffffffffb0 = (QPlainTextEditPrivate *)operator_new(0x10);
    QPlainTextDocumentLayout::QPlainTextDocumentLayout
              ((QPlainTextDocumentLayout *)in_stack_ffffffffffffffb0,(QTextDocument *)document_00);
    pQVar1 = in_stack_ffffffffffffffb0;
    QTextDocument::setDocumentLayout((QAbstractTextDocumentLayout *)this_01);
  }
  else {
    QTextDocument::documentLayout();
    pQVar1 = (QPlainTextEditPrivate *)qobject_cast<QPlainTextDocumentLayout*>((QObject *)0x6c4006);
    if (pQVar1 == (QPlainTextEditPrivate *)0x0) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                 (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),(char *)in_stack_ffffffffffffff98);
      QMessageLogger::warning
                (local_28,
                 "QPlainTextEdit::setDocument: Document set does not support QPlainTextDocumentLayout"
                );
      goto LAB_006c40cb;
    }
  }
  QWidgetTextControl::setDocument((QWidgetTextControl *)this_00,(QTextDocument *)pQVar1);
  pQVar2 = QPlainTextDocumentLayout::priv((QPlainTextDocumentLayout *)in_stack_ffffffffffffffa0);
  pQVar1 = this_00;
  if (pQVar2->mainViewPrivate == (QPlainTextEditPrivate *)0x0) {
    pQVar2 = QPlainTextDocumentLayout::priv((QPlainTextDocumentLayout *)this_00);
    pQVar2->mainViewPrivate = this_00;
    in_stack_ffffffffffffffa0 = this_00;
  }
  QPointer<QPlainTextDocumentLayout>::operator=
            ((QPointer<QPlainTextDocumentLayout> *)in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98);
  QPlainTextEditPrivate::updateDefaultTextOption(in_stack_ffffffffffffffb0);
  QPlainTextEditPrivate::relayoutDocument(pQVar1);
  QPlainTextEditPrivate::adjustScrollbars((QPlainTextEditPrivate *)document);
LAB_006c40cb:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPlainTextEdit::setDocument(QTextDocument *document)
{
    Q_D(QPlainTextEdit);
    QPlainTextDocumentLayout *documentLayout = nullptr;

    if (!document) {
        document = new QTextDocument(d->control);
        documentLayout = new QPlainTextDocumentLayout(document);
        document->setDocumentLayout(documentLayout);
    } else {
        documentLayout = qobject_cast<QPlainTextDocumentLayout*>(document->documentLayout());
        if (Q_UNLIKELY(!documentLayout)) {
            qWarning("QPlainTextEdit::setDocument: Document set does not support QPlainTextDocumentLayout");
            return;
        }
    }
    d->control->setDocument(document);
    if (!documentLayout->priv()->mainViewPrivate)
        documentLayout->priv()->mainViewPrivate = d;
    d->documentLayoutPtr = documentLayout;
    d->updateDefaultTextOption();
    d->relayoutDocument();
    d->adjustScrollbars();
}